

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::DebugInfoRenderer::drawInfo
          (DebugInfoRenderer *this,deUint64 secondsElapsed,int texMem,int maxTexMem,int bufMem,
          int maxBufMem,int iterNdx)

{
  ostream *poVar1;
  ulong uVar2;
  string local_2e0;
  int local_2c0;
  allocator<char> local_2b9;
  string local_2b8 [32];
  string local_298;
  int local_278;
  allocator<char> local_271;
  string local_270 [32];
  string local_250;
  int local_230;
  allocator<char> local_229;
  string local_228 [32];
  string local_208;
  char local_1e5;
  int local_1e4;
  char local_1dd;
  int local_1dc;
  char local_1d5;
  int local_1d4;
  char local_1cd;
  int local_1bc;
  undefined1 local_1b8 [8];
  ostringstream text;
  deUint64 d;
  deUint64 h;
  deUint64 m;
  int maxBufMem_local;
  int bufMem_local;
  int maxTexMem_local;
  int texMem_local;
  deUint64 secondsElapsed_local;
  DebugInfoRenderer *this_local;
  
  uVar2 = (secondsElapsed / 0x3c) / 0x3c;
  text._368_8_ = uVar2 / 0x18;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  local_1bc = (int)std::setw(2);
  poVar1 = std::operator<<((ostream *)local_1b8,(_Setw)local_1bc);
  local_1cd = (char)std::setfill<char>('0');
  poVar1 = std::operator<<(poVar1,local_1cd);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,text._368_8_);
  poVar1 = std::operator<<(poVar1,":");
  local_1d4 = (int)std::setw(2);
  poVar1 = std::operator<<(poVar1,(_Setw)local_1d4);
  local_1d5 = (char)std::setfill<char>('0');
  poVar1 = std::operator<<(poVar1,local_1d5);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2 + (uVar2 / 3 & 0xfffffffffffffff8) * -3)
  ;
  poVar1 = std::operator<<(poVar1,":");
  local_1dc = (int)std::setw(2);
  poVar1 = std::operator<<(poVar1,(_Setw)local_1dc);
  local_1dd = (char)std::setfill<char>('0');
  poVar1 = std::operator<<(poVar1,local_1dd);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(secondsElapsed / 0x3c) % 0x3c);
  poVar1 = std::operator<<(poVar1,":");
  local_1e4 = (int)std::setw(2);
  poVar1 = std::operator<<(poVar1,(_Setw)local_1e4);
  local_1e5 = (char)std::setfill<char>('0');
  poVar1 = std::operator<<(poVar1,local_1e5);
  std::ostream::operator<<(poVar1,secondsElapsed % 0x3c);
  std::__cxx11::ostringstream::str();
  addTextToBuffer(this,&local_208,0);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_228,"",&local_229);
  std::__cxx11::ostringstream::str((string *)local_1b8);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  poVar1 = (ostream *)std::ostream::operator<<(local_1b8,std::fixed);
  local_230 = (int)std::setprecision(2);
  poVar1 = std::operator<<(poVar1,(_Setprecision)local_230);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)texMem * 9.536743e-07);
  poVar1 = std::operator<<(poVar1,"/");
  std::ostream::operator<<(poVar1,(float)maxTexMem * 9.536743e-07);
  std::__cxx11::ostringstream::str();
  addTextToBuffer(this,&local_250,1);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_270,"",&local_271);
  std::__cxx11::ostringstream::str((string *)local_1b8);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  poVar1 = (ostream *)std::ostream::operator<<(local_1b8,std::fixed);
  local_278 = (int)std::setprecision(2);
  poVar1 = std::operator<<(poVar1,(_Setprecision)local_278);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)bufMem * 9.536743e-07);
  poVar1 = std::operator<<(poVar1,"/");
  std::ostream::operator<<(poVar1,(float)maxBufMem * 9.536743e-07);
  std::__cxx11::ostringstream::str();
  addTextToBuffer(this,&local_298,2);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"",&local_2b9);
  std::__cxx11::ostringstream::str((string *)local_1b8);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  local_2c0 = (int)std::setw(0);
  poVar1 = std::operator<<((ostream *)local_1b8,(_Setw)local_2c0);
  std::ostream::operator<<(poVar1,iterNdx);
  std::__cxx11::ostringstream::str();
  addTextToBuffer(this,&local_2e0,3);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  render(this);
  return;
}

Assistant:

void DebugInfoRenderer::drawInfo (const deUint64 secondsElapsed, const int texMem, const int maxTexMem, const int bufMem, const int maxBufMem, const int iterNdx)
{
	const deUint64 m = secondsElapsed / 60;
	const deUint64 h = m / 60;
	const deUint64 d = h / 24;

	{
		std::ostringstream text;

		text << std::setw(2) << std::setfill('0') << d << ":"
			 << std::setw(2) << std::setfill('0') << h % 24 << ":"
			 << std::setw(2) << std::setfill('0') << m % 60 << ":"
			 << std::setw(2) << std::setfill('0') << secondsElapsed % 60;
		addTextToBuffer(text.str(), 0);
		text.str("");

		text << std::fixed << std::setprecision(2) << (float)texMem/Mi << "/" << (float)maxTexMem/Mi;
		addTextToBuffer(text.str(), 1);
		text.str("");

		text << std::fixed << std::setprecision(2) << (float)bufMem/Mi << "/" << (float)maxBufMem/Mi;
		addTextToBuffer(text.str(), 2);
		text.str("");

		text << std::setw(0) << iterNdx;
		addTextToBuffer(text.str(), 3);
	}

	render();
}